

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_lshift_fixed_into(mp_int *r,mp_int *a,size_t bits)

{
  ulong uVar1;
  BignumInt *pBVar2;
  byte bVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  BignumInt BVar7;
  ulong uVar8;
  
  uVar4 = bits >> 6;
  bVar3 = (byte)bits & 0x3f;
  sVar6 = r->nw;
  while (sVar5 = sVar6, sVar6 = sVar5 - 1, sVar5 != 0) {
    if (sVar6 < uVar4) {
      r->w[sVar5 - 1] = 0;
    }
    else {
      uVar1 = a->nw;
      if ((-uVar4 + sVar5) - 1 < uVar1) {
        BVar7 = a->w[(sVar5 - 1) - uVar4];
      }
      else {
        BVar7 = 0;
      }
      pBVar2 = r->w;
      pBVar2[sVar5 - 1] = BVar7;
      if ((bits & 0x3f) != 0) {
        uVar8 = BVar7 << bVar3;
        pBVar2[sVar5 - 1] = uVar8;
        if (uVar4 < sVar6) {
          if ((-uVar4 + sVar5) - 2 < uVar1) {
            BVar7 = a->w[(sVar5 - 2) - uVar4];
          }
          else {
            BVar7 = 0;
          }
          pBVar2[sVar5 - 1] = BVar7 >> (0x40 - bVar3 & 0x3f) | uVar8;
        }
      }
    }
  }
  return;
}

Assistant:

void mp_lshift_fixed_into(mp_int *r, mp_int *a, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t bitoff = bits % BIGNUM_INT_BITS;

    for (size_t i = r->nw; i-- > 0 ;) {
        if (i < words) {
            r->w[i] = 0;
        } else {
            r->w[i] = mp_word(a, i - words);
            if (bitoff != 0) {
                r->w[i] <<= bitoff;
                if (i > words)
                    r->w[i] |= mp_word(a, i - words - 1) >>
                        (BIGNUM_INT_BITS - bitoff);
            }
        }
    }
}